

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderStorageTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::genCommonSource_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,NegativeTestContext *ctx,
          GLenum shaderType)

{
  bool bVar1;
  ContextType ctxType;
  char *pcVar2;
  size_t sVar3;
  long lVar4;
  int iVar5;
  ostringstream source;
  long local_198 [14];
  ios_base local_128 [264];
  
  ctxType.super_ApiType.m_bits = (ApiType)(**(code **)(**(long **)(this + 0x20) + 0x10))();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  pcVar2 = glu::getGLSLVersionDeclaration(bVar1 | GLSL_VERSION_310_ES);
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)local_198 + (int)*(undefined8 *)(local_198[0] + -0x18));
  }
  else {
    sVar3 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar2,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
  pcVar2 = SSBOArrayLengthTests::init::arraysSized + 1;
  iVar5 = (int)ctx;
  if (!bVar1) {
    if (iVar5 - 0x8e87U < 2) {
      pcVar2 = "#extension GL_EXT_tessellation_shader : require\n";
    }
    else if (iVar5 == 0x8dd9) {
      pcVar2 = "#extension GL_EXT_geometry_shader : require\n";
    }
  }
  sVar3 = strlen(pcVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar2,sVar3);
  if (iVar5 == 0x8e87) {
    lVar4 = 0x29;
    pcVar2 = "layout(triangles, equal_spacing, cw) in;\n";
  }
  else {
    if (iVar5 != 0x8e88) goto LAB_00649774;
    lVar4 = 0x1a;
    pcVar2 = "layout(vertices = 3) out;\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar2,lVar4);
LAB_00649774:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"void main() {}\n",0xf);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string genCommonSource (NegativeTestContext& ctx, glw::GLenum shaderType)
{
	const bool				isES32		= contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	const glu::GLSLVersion	version		= isES32 ? glu::GLSL_VERSION_320_ES : glu::GLSL_VERSION_310_ES;
	std::ostringstream		source;

	source << glu::getGLSLVersionDeclaration(version) << "\n"
		   << ((isES32) ? "" : getShaderExtensionDeclaration(shaderType));

	switch (shaderType)
	{
		case GL_TESS_CONTROL_SHADER:
			source	<< "layout(vertices = 3) out;\n"
					<< "void main() {}\n";
			break;

		case GL_TESS_EVALUATION_SHADER:
			source	<< "layout(triangles, equal_spacing, cw) in;\n"
					<< "void main() {}\n";
			break;

		default:
			source  << "void main() {}\n";
			break;
	}

	return source.str();
}